

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O1

void ON_SortFloatArray(sort_algorithm sort_algorithm,float *a,size_t nel)

{
  ulong uVar1;
  int iVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  ulong uVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  float *lostk [62];
  undefined8 auStack_3e8 [62];
  undefined8 auStack_1f8 [63];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (float *)0x0) {
      uVar4 = nel >> 1;
      pfVar3 = a + (nel - 1);
      uVar5 = nel - 1;
      do {
        if (uVar4 == 0) {
          fVar11 = *pfVar3;
          *pfVar3 = *a;
          uVar5 = uVar5 - 1;
          if (uVar5 == 0) {
            *a = fVar11;
            return;
          }
          pfVar3 = pfVar3 + -1;
          uVar4 = 0;
        }
        else {
          fVar11 = a[uVar4 - 1];
          uVar4 = uVar4 - 1;
        }
        pfVar7 = a + uVar4;
        if (uVar4 * 2 < uVar5) {
          uVar8 = uVar4 * 2 | 1;
          do {
            pfVar6 = a + uVar8;
            if ((uVar8 < uVar5) && (*pfVar6 <= pfVar6[1] && pfVar6[1] != *pfVar6)) {
              pfVar6 = pfVar6 + 1;
              uVar8 = uVar8 + 1;
            }
            uVar1 = uVar5;
            if (fVar11 < *pfVar6) {
              *pfVar7 = *pfVar6;
              pfVar7 = pfVar6;
              uVar1 = uVar8 * 2;
            }
            uVar8 = uVar1 + 1;
          } while (uVar8 <= uVar5);
        }
        *pfVar7 = fVar11;
      } while( true );
    }
  }
  else if (1 < nel && a != (float *)0x0) {
    uVar4 = 0;
    pfVar3 = a + (nel - 1);
LAB_005bb806:
    while( true ) {
      iVar2 = (int)uVar4;
      uVar5 = ((long)pfVar3 - (long)a >> 2) + 1;
      if (uVar5 < 9) break;
      pfVar7 = (float *)((long)a + (uVar5 & 0xfffffffffffffffe) * 2);
      fVar11 = *a;
      if (*pfVar7 < fVar11) {
        *a = *pfVar7;
        *pfVar7 = fVar11;
      }
      fVar11 = *a;
      if (*pfVar3 < fVar11) {
        *a = *pfVar3;
        *pfVar3 = fVar11;
      }
      fVar11 = *pfVar7;
      pfVar6 = a;
      pfVar9 = pfVar3;
      if (*pfVar3 < fVar11) {
        *pfVar7 = *pfVar3;
        *pfVar3 = fVar11;
      }
LAB_005bb86a:
      if (pfVar6 < pfVar7) {
        do {
          pfVar6 = pfVar6 + 1;
          if (pfVar7 <= pfVar6) break;
        } while (*pfVar6 <= *pfVar7);
      }
      if (pfVar7 <= pfVar6) {
        do {
          pfVar6 = pfVar6 + 1;
          if (pfVar3 < pfVar6) break;
        } while (*pfVar6 <= *pfVar7);
      }
      do {
        pfVar10 = pfVar9;
        pfVar9 = pfVar10 + -1;
        if (pfVar9 <= pfVar7) break;
      } while (*pfVar7 <= *pfVar9 && *pfVar9 != *pfVar7);
      if (pfVar6 <= pfVar9) {
        fVar11 = *pfVar6;
        *pfVar6 = *pfVar9;
        *pfVar9 = fVar11;
        if (pfVar9 == pfVar7) {
          pfVar7 = pfVar6;
        }
        goto LAB_005bb86a;
      }
      if (pfVar7 < pfVar10) {
        while (pfVar10 = pfVar9, pfVar7 < pfVar10) {
          if ((*pfVar10 != *pfVar7) || (pfVar9 = pfVar10 + -1, NAN(*pfVar10) || NAN(*pfVar7)))
          break;
        }
      }
      if (pfVar10 <= pfVar7) {
        while (pfVar10 = pfVar10 + -1, a < pfVar10) {
          if ((*pfVar10 != *pfVar7) || (NAN(*pfVar10) || NAN(*pfVar7))) break;
        }
      }
      if ((long)pfVar10 - (long)a < (long)pfVar3 - (long)pfVar6) goto LAB_005bb9b3;
      if (a < pfVar10) {
        auStack_1f8[iVar2] = a;
        auStack_3e8[iVar2] = pfVar10;
        uVar4 = (ulong)(iVar2 + 1);
      }
      iVar2 = (int)uVar4;
      a = pfVar6;
      if (pfVar3 <= pfVar6) goto LAB_005bb9d6;
    }
    for (; pfVar6 = a, pfVar7 = a, a < pfVar3; pfVar3 = pfVar3 + -1) {
      while (pfVar9 = pfVar6, pfVar7 = pfVar7 + 1, pfVar7 <= pfVar3) {
        pfVar6 = pfVar7;
        if (*pfVar7 < *pfVar9 || *pfVar7 == *pfVar9) {
          pfVar6 = pfVar9;
        }
      }
      fVar11 = *pfVar9;
      *pfVar9 = *pfVar3;
      *pfVar3 = fVar11;
    }
    goto LAB_005bb9d6;
  }
  return;
LAB_005bb9b3:
  if (pfVar6 < pfVar3) {
    auStack_1f8[iVar2] = pfVar6;
    auStack_3e8[iVar2] = pfVar3;
    uVar4 = (ulong)(iVar2 + 1);
  }
  iVar2 = (int)uVar4;
  pfVar3 = pfVar10;
  if (pfVar10 <= a) {
LAB_005bb9d6:
    if (iVar2 < 1) {
      return;
    }
    uVar4 = (ulong)(iVar2 - 1);
    a = (float *)auStack_1f8[uVar4];
    pfVar3 = (float *)auStack_3e8[uVar4];
  }
  goto LAB_005bb806;
}

Assistant:

void ON_SortFloatArray( 
        ON::sort_algorithm sort_algorithm,
        float* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_float(a,nel);
  else
    ON_qsort_float(a,nel);
}